

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

class_book_conflict * object_kind_to_book(object_kind *kind)

{
  wchar_t wVar1;
  class_book *pcVar2;
  player_class **pppVar3;
  ulong uVar4;
  long lVar5;
  
  pppVar3 = &classes;
  do {
    pppVar3 = &((player_class *)pppVar3)->next->next;
    if ((player_class *)pppVar3 == (player_class *)0x0) {
      return (class_book_conflict *)0x0;
    }
    wVar1 = (((player_class *)pppVar3)->magic).num_books;
    uVar4 = (ulong)(uint)wVar1;
    if (wVar1 < L'\x01') {
      uVar4 = 0;
    }
    for (lVar5 = 0; uVar4 * 0x20 != lVar5; lVar5 = lVar5 + 0x20) {
      pcVar2 = (((player_class *)pppVar3)->magic).books;
      if ((kind->tval == *(wchar_t *)((long)&pcVar2->tval + lVar5)) &&
         (kind->sval == *(wchar_t *)((long)&pcVar2->sval + lVar5))) {
        return (class_book_conflict *)((long)&pcVar2->tval + lVar5);
      }
    }
  } while( true );
}

Assistant:

const struct class_book *object_kind_to_book(const struct object_kind *kind)
{
	struct player_class *class = classes;
	while (class) {
		int i;

		for (i = 0; i < class->magic.num_books; i++)
		if ((kind->tval == class->magic.books[i].tval) &&
			(kind->sval == class->magic.books[i].sval)) {
			return &class->magic.books[i];
		}
		class = class->next;
	}

	return NULL;
}